

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O0

void __thiscall
S2Builder::Graph::MakeSiblingMap(Graph *this,vector<int,_std::allocator<int>_> *in_edge_ids)

{
  SiblingPairs SVar1;
  EdgeType EVar2;
  EdgeId EVar3;
  DegenerateEdges DVar4;
  int iVar5;
  int iVar6;
  Edge *pEVar7;
  reference pvVar8;
  Edge *e_00;
  ostream *poVar9;
  bool bVar10;
  S2LogMessage local_e8;
  S2LogMessageVoidify local_d2;
  byte local_d1;
  S2LogMessage local_d0;
  S2LogMessageVoidify local_ba;
  byte local_b9;
  S2LogMessage local_b8;
  S2LogMessageVoidify local_a2;
  byte local_a1;
  S2LogMessage local_a0;
  S2LogMessageVoidify local_8a;
  byte local_89;
  S2LogMessage local_88;
  S2LogMessageVoidify local_75;
  int local_74;
  int local_70;
  VertexId v;
  EdgeId e_1;
  S2LogMessageVoidify local_51;
  Edge local_50;
  int local_48;
  EdgeId e;
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *in_edge_ids_local;
  Graph *this_local;
  
  local_18 = in_edge_ids;
  in_edge_ids_local = (vector<int,_std::allocator<int>_> *)this;
  SVar1 = GraphOptions::sibling_pairs(&this->options_);
  local_31 = 0;
  bVar10 = true;
  if (SVar1 != REQUIRE) {
    SVar1 = GraphOptions::sibling_pairs(&this->options_);
    bVar10 = true;
    if (SVar1 != CREATE) {
      EVar2 = GraphOptions::edge_type(&this->options_);
      bVar10 = EVar2 == UNDIRECTED;
    }
  }
  if (!bVar10) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
               ,0x51,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar9 = S2LogMessage::stream(&local_30);
    poVar9 = std::operator<<(poVar9,
                             "Check failed: options_.sibling_pairs() == SiblingPairs::REQUIRE || options_.sibling_pairs() == SiblingPairs::CREATE || options_.edge_type() == EdgeType::UNDIRECTED "
                            );
    S2LogMessageVoidify::operator&(&local_19,poVar9);
  }
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  for (local_48 = 0; iVar5 = local_48, EVar3 = num_edges(this), iVar5 < EVar3;
      local_48 = local_48 + 1) {
    pEVar7 = edge(this,local_48);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_48);
    e_00 = edge(this,*pvVar8);
    local_50 = reverse(e_00);
    bVar10 = std::operator==(pEVar7,&local_50);
    v._3_1_ = 0;
    if (((bVar10 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&e_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                 ,0x53,kFatal,(ostream *)&std::cerr);
      v._3_1_ = 1;
      poVar9 = S2LogMessage::stream((S2LogMessage *)&e_1);
      poVar9 = std::operator<<(poVar9,"Check failed: edge(e) == reverse(edge((*in_edge_ids)[e])) ");
      S2LogMessageVoidify::operator&(&local_51,poVar9);
    }
    if ((v._3_1_ & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&e_1);
    }
  }
  EVar2 = GraphOptions::edge_type(&this->options_);
  if ((EVar2 != DIRECTED) &&
     (DVar4 = GraphOptions::degenerate_edges(&this->options_), DVar4 != DISCARD)) {
    for (local_70 = 0; iVar5 = local_70, EVar3 = num_edges(this), iVar5 < EVar3;
        local_70 = local_70 + 1) {
      pEVar7 = edge(this,local_70);
      local_74 = pEVar7->first;
      pEVar7 = edge(this,local_70);
      if (pEVar7->second == local_74) {
        iVar5 = local_70 + 1;
        EVar3 = num_edges(this);
        local_89 = 0;
        if (EVar3 <= iVar5) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&local_88,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                     ,0x5b,kFatal,(ostream *)&std::cerr);
          local_89 = 1;
          poVar9 = S2LogMessage::stream(&local_88);
          poVar9 = std::operator<<(poVar9,"Check failed: (e + 1) < (num_edges()) ");
          S2LogMessageVoidify::operator&(&local_75,poVar9);
        }
        if ((local_89 & 1) != 0) {
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_88);
        }
        pEVar7 = edge(this,local_70 + 1);
        local_a1 = 0;
        if (pEVar7->first != local_74) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&local_a0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                     ,0x5c,kFatal,(ostream *)&std::cerr);
          local_a1 = 1;
          poVar9 = S2LogMessage::stream(&local_a0);
          poVar9 = std::operator<<(poVar9,"Check failed: (edge(e + 1).first) == (v) ");
          S2LogMessageVoidify::operator&(&local_8a,poVar9);
        }
        if ((local_a1 & 1) != 0) {
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_a0);
        }
        pEVar7 = edge(this,local_70 + 1);
        local_b9 = 0;
        if (pEVar7->second != local_74) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&local_b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                     ,0x5d,kFatal,(ostream *)&std::cerr);
          local_b9 = 1;
          poVar9 = S2LogMessage::stream(&local_b8);
          poVar9 = std::operator<<(poVar9,"Check failed: (edge(e + 1).second) == (v) ");
          S2LogMessageVoidify::operator&(&local_a2,poVar9);
        }
        if ((local_b9 & 1) != 0) {
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_b8);
        }
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_70);
        local_d1 = 0;
        if (*pvVar8 != local_70) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&local_d0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                     ,0x5e,kFatal,(ostream *)&std::cerr);
          local_d1 = 1;
          poVar9 = S2LogMessage::stream(&local_d0);
          poVar9 = std::operator<<(poVar9,"Check failed: ((*in_edge_ids)[e]) == (e) ");
          S2LogMessageVoidify::operator&(&local_ba,poVar9);
        }
        if ((local_d1 & 1) != 0) {
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_d0);
        }
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)(local_70 + 1));
        if (*pvVar8 != local_70 + 1) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&local_e8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                     ,0x5f,kFatal,(ostream *)&std::cerr);
          poVar9 = S2LogMessage::stream(&local_e8);
          poVar9 = std::operator<<(poVar9,"Check failed: ((*in_edge_ids)[e + 1]) == (e + 1) ");
          S2LogMessageVoidify::operator&(&local_d2,poVar9);
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_e8);
        }
        iVar6 = local_70 + 1;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_70);
        iVar5 = local_70;
        *pvVar8 = iVar6;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)(local_70 + 1));
        *pvVar8 = iVar5;
        local_70 = local_70 + 1;
      }
    }
  }
  return;
}

Assistant:

void Graph::MakeSiblingMap(vector<Graph::EdgeId>* in_edge_ids) const {
  S2_DCHECK(options_.sibling_pairs() == SiblingPairs::REQUIRE ||
         options_.sibling_pairs() == SiblingPairs::CREATE ||
         options_.edge_type() == EdgeType::UNDIRECTED);
  for (EdgeId e = 0; e < num_edges(); ++e) {
    S2_DCHECK(edge(e) == reverse(edge((*in_edge_ids)[e])));
  }
  if (options_.edge_type() == EdgeType::DIRECTED) return;
  if (options_.degenerate_edges() == DegenerateEdges::DISCARD) return;

  for (EdgeId e = 0; e < num_edges(); ++e) {
    VertexId v = edge(e).first;
    if (edge(e).second == v) {
      S2_DCHECK_LT(e + 1, num_edges());
      S2_DCHECK_EQ(edge(e + 1).first, v);
      S2_DCHECK_EQ(edge(e + 1).second, v);
      S2_DCHECK_EQ((*in_edge_ids)[e], e);
      S2_DCHECK_EQ((*in_edge_ids)[e + 1], e + 1);
      (*in_edge_ids)[e] = e + 1;
      (*in_edge_ids)[e + 1] = e;
      ++e;
    }
  }
}